

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

int search::negamax(int alpha,int beta,int depth,Board *pos,SearchInfo *info,PVTable *pvtable)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int *piVar6;
  reference pMVar7;
  int local_148;
  Move local_e8;
  Move move_1;
  iterator __end1;
  iterator __begin1;
  vector<board::Move,_std::allocator<board::Move>_> *__range1;
  undefined1 local_c0 [20];
  int score;
  int oldAlpha;
  int legal;
  Move bestMove;
  Move move;
  iterator __end2;
  iterator __begin2;
  vector<board::Move,_std::allocator<board::Move>_> *__range2;
  Move pvMove;
  MoveList local_68;
  undefined1 local_50 [8];
  vector<board::Move,_std::allocator<board::Move>_> moves;
  int score_1;
  bool inCheck;
  PVTable *pvtable_local;
  SearchInfo *info_local;
  Board *pos_local;
  int depth_local;
  int beta_local;
  int alpha_local;
  
  uVar5 = SearchInfo::getNodes(info);
  if ((uVar5 & 0x7ff) == 0) {
    checkup(info);
  }
  SearchInfo::incrementNodes(info);
  bVar1 = isRepetition(pos);
  if (((bVar1) || (iVar2 = board::Board::getFiftyMove(pos), 99 < iVar2)) &&
     (iVar2 = board::Board::getPly(pos), 0 < iVar2)) {
    beta_local = 0;
  }
  else {
    iVar3 = board::Board::getSide(pos);
    iVar2 = 0xc;
    if (iVar3 == 0) {
      iVar2 = 6;
    }
    piVar6 = board::Board::getPieceList(pos,iVar2);
    iVar2 = *piVar6;
    uVar4 = board::Board::getSide(pos);
    moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = board::Board::sqAttacked(pos,iVar2,uVar4 ^ 1);
    pos_local._0_4_ = depth;
    if ((bool)moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._7_1_) {
      pos_local._0_4_ = depth + 1;
    }
    depth_local = alpha;
    if ((int)pos_local == 0) {
      moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = board::evaluate::score(pos);
      if (beta <= (int)moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage) {
        return beta;
      }
      if (alpha < (int)moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage) {
        depth_local = (int)moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
    }
    movegen::generateAll(&local_68,pos,(int)pos_local == 0);
    MoveList::getMoves((vector<board::Move,_std::allocator<board::Move>_> *)local_50,&local_68);
    MoveList::~MoveList(&local_68);
    register0x00000000 = PVTable::getMove(pvtable,pos);
    iVar2 = board::Move::getValue((Move *)((long)&__range2 + 4));
    if (iVar2 != 0) {
      __end2 = std::vector<board::Move,_std::allocator<board::Move>_>::begin
                         ((vector<board::Move,_std::allocator<board::Move>_> *)local_50);
      move = (Move)std::vector<board::Move,_std::allocator<board::Move>_>::end
                             ((vector<board::Move,_std::allocator<board::Move>_> *)local_50);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>
                                         *)&move), bVar1) {
        pMVar7 = __gnu_cxx::
                 __normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>
                 ::operator*(&__end2);
        bestMove = *pMVar7;
        iVar2 = board::Move::getValue((Move *)((long)&__range2 + 4));
        iVar3 = board::Move::getValue(&bestMove);
        if (iVar2 == iVar3) {
          board::Move::addScore(&bestMove,2000000);
          break;
        }
        __gnu_cxx::
        __normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>::
        operator++(&__end2);
      }
    }
    board::Move::Move((Move *)&oldAlpha);
    score = 0;
    local_c0._16_4_ = depth_local;
    local_c0._12_4_ = -0x7fffffff;
    std::vector<board::Move,_std::allocator<board::Move>_>::rbegin
              ((vector<board::Move,_std::allocator<board::Move>_> *)local_c0);
    std::vector<board::Move,_std::allocator<board::Move>_>::rend
              ((vector<board::Move,_std::allocator<board::Move>_> *)&__range1);
    std::
    sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<board::Move*,std::vector<board::Move,std::allocator<board::Move>>>>>
              ((reverse_iterator<__gnu_cxx::__normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>_>
                *)local_c0,
               (reverse_iterator<__gnu_cxx::__normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>_>
                *)&__range1);
    __end1 = std::vector<board::Move,_std::allocator<board::Move>_>::begin
                       ((vector<board::Move,_std::allocator<board::Move>_> *)local_50);
    move_1 = (Move)std::vector<board::Move,_std::allocator<board::Move>_>::end
                             ((vector<board::Move,_std::allocator<board::Move>_> *)local_50);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>
                                       *)&move_1), bVar1) {
      pMVar7 = __gnu_cxx::
               __normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>
               ::operator*(&__end1);
      local_e8 = *pMVar7;
      bVar1 = board::makemove::move(&local_e8,pos);
      if (bVar1) {
        score = score + 1;
        if ((int)pos_local < 1) {
          local_148 = 0;
        }
        else {
          local_148 = (int)pos_local + -1;
        }
        local_c0._12_4_ = negamax(-beta,-depth_local,local_148,pos,info,pvtable);
        local_c0._12_4_ = -local_c0._12_4_;
        board::makemove::undo(pos);
        bVar1 = SearchInfo::getStopped(info);
        if (bVar1) {
          beta_local = 0;
          goto LAB_0010cbea;
        }
        if (depth_local < (int)local_c0._12_4_) {
          if (beta <= (int)local_c0._12_4_) {
            beta_local = beta;
            if ((0 < (int)pos_local) &&
               (uVar4 = board::Move::getValue(&local_e8), (uVar4 & 0x7c000) == 0)) {
              iVar2 = board::Move::getValue(&local_e8);
              board::Board::addSearchKiller(pos,iVar2);
            }
            goto LAB_0010cbea;
          }
          depth_local = local_c0._12_4_;
          _oldAlpha = local_e8;
          if ((0 < (int)pos_local) &&
             (uVar4 = board::Move::getValue(&local_e8), (uVar4 & 0x7c000) == 0)) {
            iVar2 = board::Move::getValue(&local_e8);
            iVar2 = board::Move::TOSQ(iVar2);
            iVar3 = board::Move::getValue(&local_e8);
            iVar3 = board::Move::FROMSQ(iVar3);
            board::Board::incrementSearchHistory(pos,iVar2,iVar3,(int)pos_local);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<board::Move_*,_std::vector<board::Move,_std::allocator<board::Move>_>_>::
      operator++(&__end1);
    }
    if (((int)pos_local < 1) || (score != 0)) {
      if (depth_local != local_c0._16_4_) {
        PVTable::addMove(pvtable,pos,(Move *)&oldAlpha);
      }
      beta_local = depth_local;
    }
    else if ((moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      beta_local = 0;
    }
    else {
      iVar2 = board::Board::getPly(pos);
      beta_local = iVar2 + -0x7ffffffe;
    }
LAB_0010cbea:
    std::vector<board::Move,_std::allocator<board::Move>_>::~vector
              ((vector<board::Move,_std::allocator<board::Move>_> *)local_50);
  }
  return beta_local;
}

Assistant:

int search::negamax(int alpha, int beta, int depth, board::Board& pos, SearchInfo& info, PVTable& pvtable)
{
    if ((info.getNodes() & 2047) == 0) {
        checkup(info);
    }
    info.incrementNodes();
    if ((isRepetition(pos) || pos.getFiftyMove() >= 100) && pos.getPly() > 0) {
        return 0;
    }
    bool inCheck =
        pos.sqAttacked(pos.getPieceList(pos.getSide() == board::WHITE ? board::WK : board::BK)[0], pos.getSide() ^ 1);
    if (inCheck) {
        depth++;
    }
    if (depth == 0) {
        int score = board::evaluate::score(pos);
        if (score >= beta) {
            return beta;
        }
        if (score > alpha) {
            alpha = score;
        }
    }
    std::vector<board::Move> moves = movegen::generateAll(pos, depth == 0).getMoves();
    board::Move pvMove = pvtable.getMove(pos);
    if (pvMove.getValue() != 0) {
        for (board::Move move : moves) {
            if (pvMove.getValue() == move.getValue()) {
                move.addScore(2000000);
                break;
            }
        }
    }
    board::Move bestMove;
    int legal = 0;
    int oldAlpha = alpha;
    int score = NEG_INFINITY;
    std::sort(moves.rbegin(), moves.rend());
    for (board::Move move : moves) {
        if (!board::makemove::move(move, pos)) {
            continue;
        }
        legal++;
        score = -negamax(-beta, -alpha, depth > 0 ? depth - 1 : 0, pos, info, pvtable);
        board::makemove::undo(pos);
        if (info.getStopped()) {
            return 0;
        }
        if (score > alpha) {
            if (score >= beta) {
                if (depth > 0) {
                    if (!(move.getValue() & board::Move::MFLAGCAP)) {
                        pos.addSearchKiller(move.getValue());
                    }
                }
                return beta;
            }
            alpha = score;
            bestMove = move;
            if (depth > 0) {
                if (!(move.getValue() & board::Move::MFLAGCAP)) {
                    pos.incrementSearchHistory(board::Move::TOSQ(move.getValue()), board::Move::FROMSQ(move.getValue()),
                                               depth);
                }
            }
        }
    }
    if (depth > 0 && legal == 0) {
        if (inCheck) {
            return -POS_INFINITY + pos.getPly();
        }
        return 0;
    }
    if (alpha != oldAlpha) {
        pvtable.addMove(pos, bestMove);
    }
    return alpha;
}